

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O1

void remove_zero_pad(double *Y,int rows,int cols,int zrow,int zcol,double *Z)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (rows - zrow != 0 && zrow <= rows) {
    uVar1 = cols - zcol;
    uVar2 = 0;
    do {
      if (0 < (int)uVar1) {
        uVar3 = 0;
        do {
          Z[uVar3] = Y[uVar3];
          uVar3 = uVar3 + 1;
        } while (uVar1 != uVar3);
      }
      uVar2 = uVar2 + 1;
      Z = Z + (int)uVar1;
      Y = Y + cols;
    } while (uVar2 != (uint)(rows - zrow));
  }
  return;
}

Assistant:

void remove_zero_pad(double *Y, int rows, int cols, int zrow, int zcol,double *Z) {
	int r,c,i,j,u,v;
	r = rows - zrow;
	c = cols - zcol;
	
	for (i = 0; i < r; ++i) {
		u = i * c;
		v = i * cols;
		for (j = 0; j < c; ++j) {
			Z[j + u] = Y[j + v];
		}
	}
}